

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_options.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::basic_csv_decode_options<char>::basic_csv_decode_options
          (basic_csv_decode_options<char> *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  unsigned_long uVar10;
  ushort uVar11;
  basic_csv_options_common<char> *in_RDI;
  
  basic_csv_options_common<char>::basic_csv_options_common(in_RDI);
  in_RDI->_vptr_basic_csv_options_common = (_func_int **)0x1339390;
  (in_RDI->neginf_to_num_).field_2._M_allocated_capacity = 0x13393b8;
  uVar11._0_1_ = in_RDI->field_delimiter_;
  uVar11._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar11 & 0xfffe);
  in_RDI->quote_char_ = (char)((uVar11 & 0xfffe) >> 8);
  uVar1._0_1_ = in_RDI->field_delimiter_;
  uVar1._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar1 & 0xfffd);
  in_RDI->quote_char_ = (char)((uVar1 & 0xfffd) >> 8);
  uVar2._0_1_ = in_RDI->field_delimiter_;
  uVar2._1_1_ = in_RDI->quote_char_;
  uVar11 = uVar2 & 0xfffb | 4;
  in_RDI->field_delimiter_ = (char)uVar11;
  in_RDI->quote_char_ = (char)(uVar11 >> 8);
  uVar3._0_1_ = in_RDI->field_delimiter_;
  uVar3._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar3 & 0xfff7);
  in_RDI->quote_char_ = (char)((uVar3 & 0xfff7) >> 8);
  uVar4._0_1_ = in_RDI->field_delimiter_;
  uVar4._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar4 & 0xffef);
  in_RDI->quote_char_ = (char)((uVar4 & 0xffef) >> 8);
  uVar5._0_1_ = in_RDI->field_delimiter_;
  uVar5._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar5 & 0xffdf);
  in_RDI->quote_char_ = (char)((uVar5 & 0xffdf) >> 8);
  uVar6._0_1_ = in_RDI->field_delimiter_;
  uVar6._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar6 & 0xffbf);
  in_RDI->quote_char_ = (char)((uVar6 & 0xffbf) >> 8);
  uVar7._0_1_ = in_RDI->field_delimiter_;
  uVar7._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar7 & 0xff7f);
  in_RDI->quote_char_ = (char)((uVar7 & 0xff7f) >> 8);
  uVar8._0_1_ = in_RDI->field_delimiter_;
  uVar8._1_1_ = in_RDI->quote_char_;
  uVar11 = uVar8 & 0xfeff | 0x100;
  in_RDI->field_delimiter_ = (char)uVar11;
  in_RDI->quote_char_ = (char)(uVar11 >> 8);
  uVar9._0_1_ = in_RDI->field_delimiter_;
  uVar9._1_1_ = in_RDI->quote_char_;
  in_RDI->field_delimiter_ = (char)(uVar9 & 0xfdff);
  in_RDI->quote_char_ = (char)((uVar9 & 0xfdff) >> 8);
  in_RDI->quote_escape_char_ = '\0';
  in_RDI->subfield_delimiter_ = '\0';
  *(undefined8 *)&in_RDI->nan_to_num_ = 0;
  uVar10 = std::numeric_limits<unsigned_long>::max();
  (in_RDI->nan_to_num_)._M_string_length = uVar10;
  std::__cxx11::string::string((string *)(in_RDI->nan_to_num_).field_2._M_local_buf);
  std::__cxx11::string::string((string *)(in_RDI->inf_to_num_).field_2._M_local_buf);
  return;
}

Assistant:

basic_csv_decode_options()
        : assume_header_(false),
          ignore_empty_values_(false),
          ignore_empty_lines_(true),
          trim_leading_(false),
          trim_trailing_(false),
          trim_leading_inside_quotes_(false),
          trim_trailing_inside_quotes_(false),
          unquoted_empty_value_is_null_(false),
          infer_types_(true),
          lossless_number_(false)
    {}